

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O0

void slip_or_trip(void)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  char *local_190;
  char *local_178;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_138;
  char local_128 [7];
  boolean on_foot;
  char buf [256];
  char *pronoun;
  char *what;
  obj *otmp;
  
  what = (char *)level->objects[u.ux][u.uy];
  bVar6 = u.usteed == (monst *)0x0;
  if (((((obj *)what != (obj *)0x0) && (bVar6)) && (((byte)u._1052_1_ >> 1 & 1) == 0)) &&
     (bVar1 = is_pool(level,(int)u.ux,(int)u.uy), bVar1 != '\0')) {
    what = (char *)0x0;
  }
  if ((what == (char *)0x0) || (!bVar6)) {
    iVar2 = rn2(3);
    if ((iVar2 == 0) || (bVar1 = is_ice(level,(int)u.ux,(int)u.uy), bVar1 == '\0')) {
      if (bVar6) {
        iVar2 = rn2(4);
        if (iVar2 == 1) {
          if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
             ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
            pcVar3 = body_part(5);
            local_190 = makeplural(pcVar3);
          }
          else {
            local_190 = "elbow";
          }
          pline("You trip over your own %s.",local_190);
        }
        else if (iVar2 == 2) {
          bVar6 = false;
          if (u.uprops[0x23].intrinsic != 0) {
            bVar6 = true;
            if ((u.uprops[0x24].extrinsic == 0) && (bVar6 = false, u.umonnum != u.umonster)) {
              bVar1 = dmgtype(youmonst.data,0x24);
              bVar6 = bVar1 != '\0';
            }
            bVar6 = (bool)(bVar6 ^ 1);
          }
          pcVar3 = "and nearly fall";
          if (bVar6) {
            pcVar3 = "on a banana peel";
          }
          pline("You slip %s.",pcVar3);
        }
        else if (iVar2 == 3) {
          pline("You flounder.");
        }
        else {
          pline("You stumble.");
        }
      }
      else {
        iVar2 = rn2(4);
        if (iVar2 == 1) {
          pcVar3 = body_part(5);
          pcVar3 = makeplural(pcVar3);
          pline("Your %s slip out of the stirrups.",pcVar3);
        }
        else if (iVar2 == 2) {
          pline("You let go of the reins.");
        }
        else if (iVar2 == 3) {
          pline("You bang into the saddle-horn.");
        }
        else {
          pline("You slide to one side of the saddle.");
        }
        dismount_steed(1);
      }
    }
    else {
      if (u.usteed == (monst *)0x0) {
        local_178 = "You";
      }
      else {
        pcVar3 = x_monnam(u.usteed,(uint)((u.usteed)->mnamelth == '\0'),(char *)0x0,8,'\0');
        local_178 = upstart(pcVar3);
      }
      iVar2 = rn2(2);
      pcVar3 = "green slide";
      if (iVar2 != 0) {
        pcVar3 = "rings slip";
      }
      pcVar4 = "s";
      if (bVar6) {
        pcVar4 = "";
      }
      pline("%s %s%s on the ice.",local_178,pcVar3 + 6,pcVar4);
    }
  }
  else {
    if (*(int *)(what + 0x30) == 1) {
      local_138 = "it";
    }
    else {
      bVar6 = false;
      if (u.uprops[0x23].intrinsic != 0) {
        bVar6 = true;
        if ((u.uprops[0x24].extrinsic == 0) && (bVar6 = false, u.umonnum != u.umonster)) {
          bVar1 = dmgtype(youmonst.data,0x24);
          bVar6 = bVar1 != '\0';
        }
        bVar6 = (bool)(bVar6 ^ 1);
      }
      local_138 = "them";
      if (bVar6) {
        local_138 = "they";
      }
    }
    if (*(long *)(what + 8) == 0) {
      local_148 = local_138;
    }
    else {
      if (((*(uint *)(what + 0x4a) >> 5 & 1) == 0) &&
         (((u.uprops[0x1e].intrinsic != 0 ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))))) {
        what = (char *)sobj_at(0x213,level,(int)u.ux,(int)u.uy);
        if ((obj *)what == (obj *)0x0) {
          local_158 = "something";
        }
        else {
          local_158 = "some rocks";
          if (((obj *)what)->quan == 1) {
            local_158 = "a rock";
          }
        }
        local_150 = local_158;
      }
      else {
        local_150 = doname((obj *)what);
      }
      local_148 = local_150;
    }
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
      pline("You trip over %s.",local_148);
    }
    else {
      pcVar3 = strcpy(local_128,local_148);
      local_128[0] = highc(local_128[0]);
      bVar6 = true;
      if (what != (char *)0x0) {
        bVar6 = *(int *)(what + 0x30) == 1;
      }
      pcVar4 = "";
      if (bVar6) {
        pcVar4 = "s";
      }
      pcVar5 = body_part(5);
      pline("Egads!  %s bite%s your %s!",pcVar3,pcVar4,pcVar5);
    }
  }
  return;
}

Assistant:

static void slip_or_trip(void)
{
	struct obj *otmp = vobj_at(u.ux, u.uy);
	const char *what, *pronoun;
	char buf[BUFSZ];
	boolean on_foot = TRUE;
	if (u.usteed) on_foot = FALSE;

	if (otmp && on_foot && !u.uinwater && is_pool(level, u.ux, u.uy)) otmp = 0;

	if (otmp && on_foot) {		/* trip over something in particular */
	    /*
		If there is only one item, it will have just been named
		during the move, so refer to by via pronoun; otherwise,
		if the top item has been or can be seen, refer to it by
		name; if not, look for rocks to trip over; trip over
		anonymous "something" if there aren't any rocks.
	     */
	    pronoun = otmp->quan == 1L ? "it" : Hallucination ? "they" : "them";
	    what = !otmp->nexthere ? pronoun :
		  (otmp->dknown || !Blind) ? doname(otmp) :
		  ((otmp = sobj_at(ROCK, level, u.ux, u.uy)) == 0 ? "something" :
		  (otmp->quan == 1L ? "a rock" : "some rocks"));
	    if (Hallucination) {
		what = strcpy(buf, what);
		buf[0] = highc(buf[0]);
		pline("Egads!  %s bite%s your %s!",
			what, (!otmp || otmp->quan == 1L) ? "s" : "",
			body_part(FOOT));
	    } else {
		pline("You trip over %s.", what);
	    }
	} else if (rn2(3) && is_ice(level, u.ux, u.uy)) {
	    pline("%s %s%s on the ice.",
		u.usteed ? upstart(x_monnam(u.usteed,
				u.usteed->mnamelth ? ARTICLE_NONE : ARTICLE_THE,
				NULL, SUPPRESS_SADDLE, FALSE)) :
		"You", rn2(2) ? "slip" : "slide", on_foot ? "" : "s");
	} else {
	    if (on_foot) {
		switch (rn2(4)) {
		  case 1:
			pline("You trip over your own %s.", Hallucination ?
				"elbow" : makeplural(body_part(FOOT)));
			break;
		  case 2:
			pline("You slip %s.", Hallucination ?
				"on a banana peel" : "and nearly fall");
			break;
		  case 3:
			pline("You flounder.");
			break;
		  default:
			pline("You stumble.");
			break;
		}
	    }
	    else {
		switch (rn2(4)) {
		  case 1:
			pline("Your %s slip out of the stirrups.", makeplural(body_part(FOOT)));
			break;
		  case 2:
			pline("You let go of the reins.");
			break;
		  case 3:
			pline("You bang into the saddle-horn.");
			break;
		  default:
			pline("You slide to one side of the saddle.");
			break;
		}
		dismount_steed(DISMOUNT_FELL);
	    }
	}
}